

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::GenerateCommonBuilderMethods
          (MessageBuilderLiteGenerator *this,Printer *printer)

{
  string local_30;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_30,this->name_resolver_,this->descriptor_);
  io::Printer::Print(printer,
                     "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  super(DEFAULT_INSTANCE);\n}\n\n"
                     ,"classname",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void MessageBuilderLiteGenerator::
GenerateCommonBuilderMethods(io::Printer* printer) {
  printer->Print(
    "// Construct using $classname$.newBuilder()\n"
    "private Builder() {\n"
    "  super(DEFAULT_INSTANCE);\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));
}